

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_visitor.hpp
# Opt level: O1

bool __thiscall
jsoncons::basic_json_visitor<wchar_t>::visit_half
          (basic_json_visitor<wchar_t> *this,uint16_t value,semantic_tag tag,ser_context *context,
          error_code *ec)

{
  ushort uVar1;
  uint uVar2;
  int __exponent;
  double dVar3;
  
  uVar2 = value >> 10 & 0x1f;
  uVar1 = value & 0x3ff;
  if (uVar2 == 0x1f) {
    if ((value & 0x3ff) == 0) {
      dVar3 = INFINITY;
    }
    else {
      dVar3 = nan("");
    }
  }
  else {
    if ((value & 0x7c00) == 0) {
      __exponent = -0x18;
    }
    else {
      uVar1 = uVar1 | 0x400;
      __exponent = uVar2 - 0x19;
    }
    dVar3 = ldexp((double)uVar1,__exponent);
  }
  if ((short)value < 0) {
    dVar3 = -dVar3;
  }
  (*this->_vptr_basic_json_visitor[0x12])(dVar3,this,(ulong)tag,context,ec);
  return true;
}

Assistant:

virtual JSONCONS_VISITOR_RETURN_TYPE visit_half(uint16_t value, 
            semantic_tag tag,
            const ser_context& context,
            std::error_code& ec)
        {
            visit_double(binary::decode_half(value),
                tag,
                context,
                ec);
            JSONCONS_VISITOR_RETURN;
        }